

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::CompressionParameters> * __thiscall
kj::ArrayBuilder<kj::CompressionParameters>::operator=
          (ArrayBuilder<kj::CompressionParameters> *this,
          ArrayBuilder<kj::CompressionParameters> *other)

{
  ArrayBuilder<kj::CompressionParameters> *other_local;
  ArrayBuilder<kj::CompressionParameters> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (CompressionParameters *)0x0;
  other->pos = (RemoveConst<kj::CompressionParameters> *)0x0;
  other->endPtr = (CompressionParameters *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }